

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::Load<wabt::interp::Simd<signed_char,(unsigned_char)8>>
          (Thread *this,Instr instr,Simd<signed_char,_(unsigned_char)__b_> *out,Ptr *out_trap)

{
  Store *pSVar1;
  bool bVar2;
  u32 uVar3;
  RefVec *this_00;
  const_reference pvVar4;
  Memory *pMVar5;
  ulong uVar6;
  string local_88;
  Ptr local_68;
  Enum local_50;
  u32 local_4c;
  Ref RStack_48;
  u32 offset;
  undefined1 local_40 [8];
  Ptr memory;
  Ptr *out_trap_local;
  Simd<signed_char,_(unsigned_char)__b_> *out_local;
  Thread *this_local;
  
  pSVar1 = this->store_;
  memory.root_index_ = (Index)out_trap;
  this_00 = Instance::memories(this->inst_);
  pvVar4 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                     (this_00,(ulong)instr.field_2.imm_u32);
  RStack_48.index = pvVar4->index;
  RefPtr<wabt::interp::Memory>::RefPtr((RefPtr<wabt::interp::Memory> *)local_40,pSVar1,RStack_48);
  local_4c = Pop<unsigned_int>(this);
  pMVar5 = RefPtr<wabt::interp::Memory>::operator->((RefPtr<wabt::interp::Memory> *)local_40);
  local_50 = (Enum)Memory::Load<wabt::interp::Simd<signed_char,(unsigned_char)8>>
                             (pMVar5,local_4c,instr.field_2.imm_u32x2.snd,out);
  bVar2 = Failed((Result)local_50);
  if (bVar2) {
    pSVar1 = this->store_;
    uVar6 = (ulong)local_4c;
    pMVar5 = RefPtr<wabt::interp::Memory>::operator->((RefPtr<wabt::interp::Memory> *)local_40);
    uVar3 = Memory::ByteSize(pMVar5);
    StringPrintf_abi_cxx11_
              (&local_88,"out of bounds memory access: access at %lu+%zd >= max value %u",
               uVar6 + instr.field_2.imm_u32x2.snd,8,(ulong)uVar3);
    Trap::New(&local_68,pSVar1,&local_88,&this->frames_);
    RefPtr<wabt::interp::Trap>::operator=
              ((RefPtr<wabt::interp::Trap> *)memory.root_index_,&local_68);
    this_local._4_4_ = Trap;
    RefPtr<wabt::interp::Trap>::~RefPtr(&local_68);
    std::__cxx11::string::~string((string *)&local_88);
  }
  else {
    this_local._4_4_ = Ok;
  }
  RefPtr<wabt::interp::Memory>::~RefPtr((RefPtr<wabt::interp::Memory> *)local_40);
  return this_local._4_4_;
}

Assistant:

RunResult Thread::Load(Instr instr, T* out, Trap::Ptr* out_trap) {
  Memory::Ptr memory{store_, inst_->memories()[instr.imm_u32x2.fst]};
  u32 offset = Pop<u32>();
  TRAP_IF(Failed(memory->Load(offset, instr.imm_u32x2.snd, out)),
          StringPrintf("out of bounds memory access: access at %" PRIu64
                       "+%" PRIzd " >= max value %u",
                       u64{offset} + instr.imm_u32x2.snd, sizeof(T),
                       memory->ByteSize()));
  return RunResult::Ok;
}